

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gia_GlaSendAbsracted(Gla_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Int_t *local_28;
  Vec_Int_t *vGateClasses;
  Gia_Man_t *pAbs;
  Gla_Man_t *pGStack_10;
  int fVerbose_local;
  Gla_Man_t *p_local;
  
  pAbs._4_4_ = fVerbose;
  pGStack_10 = p;
  iVar1 = Abc_FrameIsBridgeMode();
  if (iVar1 != 0) {
    local_28 = Gla_ManTranslate(pGStack_10);
    vGateClasses = (Vec_Int_t *)Gia_ManDupAbsGates(pGStack_10->pGia0,local_28);
    Vec_IntFreeP(&local_28);
    Gia_ManToBridgeAbsNetlist(_stdout,vGateClasses,0x6b);
    Gia_ManStop((Gia_Man_t *)vGateClasses);
    return;
  }
  __assert_fail("Abc_FrameIsBridgeMode()",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                ,0x62a,"void Gia_GlaSendAbsracted(Gla_Man_t *, int)");
}

Assistant:

void Gia_GlaSendAbsracted( Gla_Man_t * p, int fVerbose )
{
    Gia_Man_t * pAbs;
    Vec_Int_t * vGateClasses;
    assert( Abc_FrameIsBridgeMode() );
//    if ( fVerbose )
//        Abc_Print( 1, "Sending abstracted model...\n" );
    // create abstraction (value of p->pGia is not used here)
    vGateClasses = Gla_ManTranslate( p );
    pAbs = Gia_ManDupAbsGates( p->pGia0, vGateClasses );
    Vec_IntFreeP( &vGateClasses );
    // send it out
    Gia_ManToBridgeAbsNetlist( stdout, pAbs, BRIDGE_ABS_NETLIST );
    Gia_ManStop( pAbs );
}